

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall testing::Action<bool_()>::Perform(Action<bool_()> *this,ArgumentTuple *args)

{
  bool bVar1;
  int iVar2;
  ActionInterface<bool_()> *pAVar3;
  allocator local_39;
  string local_38;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<bool_()> *this_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)this;
  bVar1 = IsDoDefault(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,&local_39);
  internal::Assert(!bVar1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googlemock/include/gmock/gmock-actions.h"
                   ,0x185,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pAVar3 = internal::linked_ptr<testing::ActionInterface<bool_()>_>::operator->(&this->impl_);
  iVar2 = (*pAVar3->_vptr_ActionInterface[2])(pAVar3,local_18);
  return (Result)((byte)iVar2 & 1);
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }